

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

void __thiscall
Am_Inter_Location_Data::Am_Inter_Location_Data
          (Am_Inter_Location_Data *this,Am_Inter_Location_Data *proto)

{
  undefined8 uVar1;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e33e8;
  (this->ref_obj).data = (Am_Object_Data *)0x0;
  Am_Object::operator=(&this->ref_obj,&proto->ref_obj);
  this->as_line = proto->as_line;
  this->growing = proto->growing;
  this->a_control = proto->a_control;
  this->b_control = proto->b_control;
  this->c_control = proto->c_control;
  this->d_control = proto->d_control;
  uVar1 = *(undefined8 *)((long)&proto->data + 8);
  *(undefined8 *)&this->data = *(undefined8 *)&proto->data;
  *(undefined8 *)((long)&this->data + 8) = uVar1;
  return;
}

Assistant:

Am_Inter_Location_Data::Am_Inter_Location_Data(Am_Inter_Location_Data *proto)
{
  ref_obj = proto->ref_obj;
  as_line = proto->as_line;
  growing = proto->growing;
  a_control = proto->a_control;
  b_control = proto->b_control;
  c_control = proto->c_control;
  d_control = proto->d_control;
  data = proto->data;
}